

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<kj::Exception::Detail>::setCapacity(Vector<kj::Exception::Detail> *this,size_t newSize)

{
  __off_t in_RDX;
  ArrayBuilder<kj::Exception::Detail> newBuilder;
  ArrayBuilder<kj::Exception::Detail> local_30;
  
  if (newSize < (ulong)((long)(this->builder).pos - (long)(this->builder).ptr >> 5)) {
    ArrayBuilder<kj::Exception::Detail>::truncate(&this->builder,(char *)newSize,in_RDX);
  }
  local_30.ptr = _::HeapArrayDisposer::allocateUninitialized<kj::Exception::Detail>(newSize);
  local_30.endPtr = local_30.ptr + newSize;
  local_30.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<kj::Exception::Detail>::addAll<kj::ArrayBuilder<kj::Exception::Detail>>
            (&local_30,&this->builder);
  ArrayBuilder<kj::Exception::Detail>::operator=(&this->builder,&local_30);
  ArrayBuilder<kj::Exception::Detail>::dispose(&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }